

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::f_equals0(Forth *this)

{
  double dVar1;
  
  requireDStackAvailable(this,1,"F0=");
  requireFStackDepth(this,1,"F0=");
  dVar1 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  ForthStack<unsigned_int>::push(&this->dStack,(&this->False)[-(uint)(dVar1 == 0.0) & 1]);
  return;
}

Assistant:

void f_equals0() {
			REQUIRE_DSTACK_AVAILABLE(1, "F0=");
			REQUIRE_FSTACK_DEPTH(1, "F0=");
			auto n2 = fStack.getTop(); fStack.pop();
			dStack.push(0.0 == n2 ? True : False);
		}